

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateLossLayer(Result *__return_storage_ptr__,LossLayer *lossLayer,
                          NeuralNetworkValidatorGraph *graph)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  LayerCase LVar3;
  string *psVar4;
  pointer pcVar5;
  pointer ppLVar6;
  pointer pbVar7;
  size_t __n;
  LossLayer *pLVar8;
  NeuralNetworkValidatorGraph *pNVar9;
  int iVar10;
  LayerNode *pLVar11;
  long *plVar12;
  MeanSquaredErrorLossLayer *pMVar13;
  CategoricalCrossEntropyLossLayer *pCVar14;
  const_iterator cVar15;
  size_type *psVar16;
  _Base_ptr p_Var17;
  pointer ppLVar18;
  bool bVar19;
  int iVar20;
  bool bVar21;
  string targetName;
  string lossLayerName;
  string lossInputName;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  key_type local_f0;
  string local_d0;
  LossLayer *local_b0;
  Result *local_a8;
  Result local_a0;
  NeuralNetworkValidatorGraph *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(&local_a0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  if (lossLayer->_oneof_case_[0] == 0xb) {
    psVar4 = (((lossLayer->LossLayerType_).categoricalcrossentropylosslayer_)->input_).ptr_;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar5 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar5,pcVar5 + psVar4->_M_string_length);
    cVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
             ::find(&(graph->blobNameToProducingNode)._M_t,&local_f0);
    p_Var17 = &(graph->blobNameToProducingNode)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (cVar15._M_node != p_Var17) {
      if (lossLayer->_oneof_case_[0] == 0xb) {
        pMVar13 = (MeanSquaredErrorLossLayer *)
                  (lossLayer->LossLayerType_).categoricalcrossentropylosslayer_;
      }
      else {
        pMVar13 = CoreML::Specification::MeanSquaredErrorLossLayer::default_instance();
      }
      psVar4 = (pMVar13->target_).ptr_;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar5 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar5,pcVar5 + psVar4->_M_string_length);
      cVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
               ::find(&(graph->blobNameToProducingNode)._M_t,&local_130);
      if (cVar15._M_node != p_Var17) {
        std::operator+(&local_110,"For the MSE loss layer named \'",(lossLayer->name_).ptr_);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_110);
        psVar16 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_150.field_2._M_allocated_capacity = *psVar16;
          local_150.field_2._8_8_ = plVar12[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar16;
          local_150._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_150._M_string_length = plVar12[1];
        *plVar12 = (long)psVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
LAB_004febe4:
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
LAB_004febf1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (cVar15._M_node == p_Var17) {
        paVar2 = &local_a0.m_message.field_2;
        __return_storage_ptr__->m_type = local_a0.m_type;
        __return_storage_ptr__->m_reason = local_a0.m_reason;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.m_message._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_a0.m_message.field_2._M_allocated_capacity._1_7_,
                        local_a0.m_message.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
               local_a0.m_message.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_a0.m_message._M_dataplus._M_p
          ;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_a0.m_message.field_2._M_allocated_capacity._1_7_,
                        local_a0.m_message.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_a0.m_message._M_string_length;
        local_a0.m_message._M_string_length = 0;
        local_a0.m_message.field_2._M_local_buf[0] = '\0';
        local_a0.m_message._M_dataplus._M_p = (pointer)paVar2;
      }
      goto LAB_004feedc;
    }
    std::operator+(&local_150,"For the MSE loss layer named \'",(lossLayer->name_).ptr_);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
    psVar16 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_130.field_2._M_allocated_capacity = *psVar16;
      local_130.field_2._8_8_ = plVar12[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar16;
      local_130._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_130._M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_004feedc;
  }
  else {
    if (lossLayer->_oneof_case_[0] != 10) {
      std::operator+(&local_130,"Loss function is not recognized in the loss layer named \'",
                     (lossLayer->name_).ptr_);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_130);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_f0.field_2._M_allocated_capacity = *psVar16;
        local_f0.field_2._8_8_ = plVar12[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar16;
        local_f0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_f0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0)
      ;
      goto LAB_004feedc;
    }
    psVar4 = (((lossLayer->LossLayerType_).categoricalcrossentropylosslayer_)->input_).ptr_;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar5 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar5,pcVar5 + psVar4->_M_string_length);
    psVar4 = (lossLayer->name_).ptr_;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar5 = (psVar4->_M_dataplus)._M_p;
    local_b0 = lossLayer;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar5,pcVar5 + psVar4->_M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    pLVar11 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName(graph,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (pLVar11 == (LayerNode *)0x0) {
      std::operator+(&local_110,"Failed to look up node for \'",&local_130);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_150.field_2._M_allocated_capacity = *psVar16;
        local_150.field_2._8_8_ = plVar12[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar16;
        local_150._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_150._M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0)
      ;
    }
    else {
      ppLVar18 = (pLVar11->parents).
                 super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppLVar6 = (pLVar11->parents).
                super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_78 = graph;
      if (ppLVar18 == ppLVar6) {
        bVar21 = true;
        bVar19 = false;
      }
      else {
        local_a8 = __return_storage_ptr__;
        bVar21 = false;
        do {
          LVar3 = (*ppLVar18)->layerType;
          if (LVar3 == kSoftmax) {
            pbVar7 = ((*ppLVar18)->outputNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __n = pbVar7->_M_string_length;
            if (__n == local_f0._M_string_length) {
              iVar20 = 3;
              bVar19 = true;
              if ((__n == 0) ||
                 (iVar10 = bcmp((pbVar7->_M_dataplus)._M_p,local_f0._M_dataplus._M_p,__n),
                 iVar10 == 0)) goto LAB_004fe824;
            }
            std::operator+(&local_110,"For the categorical cross entropy loss layer named \'",
                           (local_b0->name_).ptr_);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_110);
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_150.field_2._M_allocated_capacity = *psVar16;
              local_150.field_2._8_8_ = plVar12[3];
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            }
            else {
              local_150.field_2._M_allocated_capacity = *psVar16;
              local_150._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_150._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            iVar20 = 1;
            CoreML::Result::Result(local_a8,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
            bVar19 = bVar21;
          }
          else {
            iVar20 = 0;
            bVar19 = bVar21;
          }
LAB_004fe824:
          if (LVar3 == kSoftmax) goto LAB_004fe843;
          ppLVar18 = ppLVar18 + 1;
          bVar21 = bVar19;
        } while (ppLVar18 != ppLVar6);
        iVar20 = 3;
LAB_004fe843:
        bVar21 = iVar20 == 3;
        __return_storage_ptr__ = local_a8;
      }
      pNVar9 = local_78;
      pLVar8 = local_b0;
      if (bVar21) {
        if (bVar19) {
          if (local_b0->_oneof_case_[0] == 10) {
            pCVar14 = (local_b0->LossLayerType_).categoricalcrossentropylosslayer_;
          }
          else {
            pCVar14 = CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
          }
          psVar4 = (pCVar14->target_).ptr_;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          pcVar5 = (psVar4->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,pcVar5,pcVar5 + psVar4->_M_string_length);
          cVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                   ::find(&(pNVar9->blobNameToProducingNode)._M_t,&local_150);
          p_Var17 = &(pNVar9->blobNameToProducingNode)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (cVar15._M_node != p_Var17) {
            std::operator+(&local_50,"For the cross entropy loss layer named \'",
                           (pLVar8->name_).ptr_);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_110.field_2._M_allocated_capacity = *psVar16;
              local_110.field_2._8_8_ = plVar12[3];
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            }
            else {
              local_110.field_2._M_allocated_capacity = *psVar16;
              local_110._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_110._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            CoreML::Result::Result
                      (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_004febe4;
          goto LAB_004febf1;
        }
        std::operator+(&local_110,"For the categorical cross entropy loss layer named \'",
                       (local_b0->name_).ptr_);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_110);
        psVar16 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_150.field_2._M_allocated_capacity = *psVar16;
          local_150.field_2._8_8_ = plVar12[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar16;
          local_150._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_150._M_string_length = plVar12[1];
        *plVar12 = (long)psVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_004feedc;
  }
  operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
LAB_004feedc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_message._M_dataplus._M_p != &local_a0.m_message.field_2) {
    operator_delete(local_a0.m_message._M_dataplus._M_p,
                    CONCAT71(local_a0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_a0.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateLossLayer(const Specification::LossLayer *lossLayer, const NeuralNetworkValidatorGraph *graph) {
    Result r;
    std::string err;
    
    switch (lossLayer->LossLayerType_case()) {
        case CoreML::Specification::LossLayer::kCategoricalCrossEntropyLossLayer:
        {
            std::string lossInputName = lossLayer->categoricalcrossentropylosslayer().input();

            // validate loss input.
            std::string lossLayerName = lossLayer->name();
            const auto *lossNode = graph->getNodeFromName(lossLayerName);
            if (lossNode == NULL) {
                err = "Failed to look up node for '" + lossLayerName + "'.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            bool lossInputValidated = false;
            const auto &parents = lossNode->parents;
            for (const auto *node : parents) {
                if (node->layerType == Specification::NeuralNetworkLayer::kSoftmax) {
                    if (node->outputNames[0] != lossInputName) {
                        err = "For the categorical cross entropy loss layer named '" + lossLayer->name() + "', input is not generated from a softmax output.";
                        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                    }
                    lossInputValidated = true;
                    break;
                }
            }

            if (!lossInputValidated) {
                err = "For the categorical cross entropy loss layer named '" + lossLayer->name() + "', input is not generated from a softmax output.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }

            // validate loss target
            std::string targetName = lossLayer->categoricalcrossentropylosslayer().target();
            if (graph->blobNameToProducingNode.find(targetName) != graph->blobNameToProducingNode.end()) {
                err = "For the cross entropy loss layer named '" + lossLayer->name() + "', target is generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            break;
        }
        case CoreML::Specification::LossLayer::kMeanSquaredErrorLossLayer:
        {
            std::string inputName = lossLayer->meansquarederrorlosslayer().input();
            if (graph->blobNameToProducingNode.find(inputName) == graph->blobNameToProducingNode.end()) {
                err = "For the MSE loss layer named '" + lossLayer->name() + "', input is not generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            std::string targetName = lossLayer->meansquarederrorlosslayer().target();
            if (graph->blobNameToProducingNode.find(targetName) != graph->blobNameToProducingNode.end()) {
                err = "For the MSE loss layer named '" + lossLayer->name() + "', target is generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            break;
        }
        default:
            err = "Loss function is not recognized in the loss layer named '" + lossLayer->name() + "', only cross entropy loss and MSE are supported.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    return r;
}